

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O3

string * Kraken::build_query(string *__return_storage_ptr__,KInput *input)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  string *psVar4;
  ostringstream oss;
  char local_1a9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  p_Var3 = (input->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(input->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      if (p_Var3 != (input->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
        local_1a9 = '&';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
      }
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      local_1a9 = '=';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,*(char **)(p_Var3 + 2),(long)p_Var3[2]._M_parent);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  psVar4 = (string *)std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

static std::string build_query(const KInput& input)
{
   std::ostringstream oss;
   KInput::const_iterator it = input.begin();
   for (; it != input.end(); ++it) {
      if (it != input.begin()) oss << '&';  // delimiter
      oss << it->first <<'='<< it->second;
   }

   return oss.str();
}